

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::JsRTConstructCallAction_Parse
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  uint uVar1;
  uint32 uVar2;
  TTDVar pvVar3;
  void **ppvVar4;
  ulong uVar5;
  
  if (evt->EventKind == ConstructCallActionTag) {
    (*reader->_vptr_FileReader[3])(reader,0x12,1);
    pvVar3 = NSSnapValues::ParseTTDVar(false,reader);
    *(TTDVar *)(evt + 1) = pvVar3;
    uVar2 = FileReader::ReadLengthValue(reader,true);
    *(uint32 *)&evt[1].EventTimeStamp = uVar2;
    ppvVar4 = SlabAllocatorBase<8>::SlabAllocateArray<void*>(alloc,(ulong)uVar2);
    *(void ***)(evt + 2) = ppvVar4;
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    if ((int)evt[1].EventTimeStamp != 0) {
      uVar5 = 0;
      do {
        pvVar3 = NSSnapValues::ParseTTDVar(uVar5 != 0,reader);
        *(TTDVar *)(*(long *)(evt + 2) + uVar5 * 8) = pvVar3;
        uVar5 = uVar5 + 1;
      } while (uVar5 < (uint)evt[1].EventTimeStamp);
    }
    (*reader->_vptr_FileReader[5])(reader);
    uVar1 = (uint)evt[1].EventTimeStamp;
    if (uVar1 < 2) {
      ppvVar4 = (void **)0x0;
    }
    else {
      ppvVar4 = SlabAllocatorBase<8>::SlabAllocateArray<void*>(alloc,(ulong)(uVar1 - 1));
    }
    evt[2].EventTimeStamp = (int64)ppvVar4;
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void JsRTConstructCallAction_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            JsRTConstructCallAction* ccAction = GetInlineEventDataAs<JsRTConstructCallAction, EventKind::ConstructCallActionTag>(evt);

            reader->ReadKey(NSTokens::Key::argRetVal, true);
            ccAction->Result = NSSnapValues::ParseTTDVar(false, reader);

            ccAction->ArgCount = reader->ReadLengthValue(true);
            ccAction->ArgArray = alloc.SlabAllocateArray<TTDVar>(ccAction->ArgCount);

            reader->ReadSequenceStart_WDefaultKey(true);
            for(uint32 i = 0; i < ccAction->ArgCount; ++i)
            {
                ccAction->ArgArray[i] = NSSnapValues::ParseTTDVar(i != 0, reader);
            }
            reader->ReadSequenceEnd();

            ccAction->ExecArgs = (ccAction->ArgCount > 1) ? alloc.SlabAllocateArray<Js::Var>(ccAction->ArgCount - 1) : nullptr; //ArgCount includes slot for function which we don't use in exec
        }